

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

bool IsArguments(ParseNode *pnode)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ParseNodeTri *pPVar7;
  ParseNodeArrLit *pPVar8;
  ParseNodePtr *ppPVar9;
  ParseNodeCall *pPVar10;
  ParseNodeUni *pPVar11;
  ParseNodeBin *pPVar12;
  ParseNodeName *pPVar13;
  uint nop;
  ParseNode *this;
  byte bVar14;
  undefined4 local_34;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_34 = SUB84(puVar6,0);
  do {
    OVar1 = pnode->nop;
    bVar14 = 1;
    nop = (uint)OVar1;
    if (OVar1 < knopObject) {
      if (OVar1 == knopArray) {
        pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
        if (((pPVar8->field_0x20 & 4) == 0) &&
           (pPVar8 = ParseNode::AsParseNodeArrLit(pnode), pPVar8->count != 0)) {
          pPVar11 = ParseNode::AsParseNodeUni(pnode);
          ppPVar9 = &pPVar11->pnode1;
          goto LAB_008068c7;
        }
      }
      else {
        if (OVar1 != knopName) {
          if (nop != 0x16) goto switchD_00806853_caseD_30;
          goto switchD_00806853_caseD_50;
        }
        pPVar13 = ParseNode::AsParseNodeName(pnode);
        if (pPVar13->sym != (Symbol *)0x0) {
          pPVar13 = ParseNode::AsParseNodeName(pnode);
          bVar4 = Symbol::IsArguments(pPVar13->sym);
          return bVar4;
        }
      }
LAB_00806a9c:
      bVar14 = 0;
      goto switchD_00806853_caseD_50;
    }
    switch(OVar1) {
    case knopCall:
    case knopNew:
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = IsArguments(pPVar10->pnodeTarget);
      if (!bVar4) {
        pPVar10 = ParseNode::AsParseNodeCall(pnode);
        if (pPVar10->pnodeArgs == (ParseNodePtr)0x0) goto LAB_00806a9c;
        pPVar10 = ParseNode::AsParseNodeCall(pnode);
        while( true ) {
          this = pPVar10->pnodeArgs;
          bVar4 = this->nop != knopList;
          if (bVar4) break;
          pPVar12 = ParseNode::AsParseNodeBin(this);
          bVar3 = IsArguments(pPVar12->pnode1);
          if (bVar3) {
            local_34 = 1;
            this = pnode;
            break;
          }
          pPVar10 = (ParseNodeCall *)ParseNode::AsParseNodeBin(this);
        }
        bVar14 = (byte)local_34;
        pnode = this;
        goto joined_r0x00806a66;
      }
      goto switchD_00806853_caseD_50;
    case knopQmark:
      pPVar7 = ParseNode::AsParseNodeTri(pnode);
      bVar4 = IsArguments(pPVar7->pnode1);
      if (bVar4) goto switchD_00806853_caseD_50;
      pPVar7 = ParseNode::AsParseNodeTri(pnode);
      bVar4 = IsArguments(pPVar7->pnode2);
      if (bVar4) goto switchD_00806853_caseD_50;
      pPVar7 = ParseNode::AsParseNodeTri(pnode);
      ppPVar9 = &pPVar7->pnode3;
LAB_008068c7:
      pnode = *ppPVar9;
      break;
    case knopList:
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
    case knopFncDecl:
    case knopClassDecl:
    case knopFor:
    case knopIf:
    case knopWhile:
    case knopDoWhile:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopBlock:
    case knopWith:
    case knopBreak:
    case knopContinue:
    case knopTryCatch:
    case knopReturn:
    case knopTry:
    case knopThrow:
    case knopFinally:
    case knopTryFinally:
    case knopObjectPattern:
    case knopArrayPattern:
    case knopParamPattern:
      goto switchD_00806853_caseD_50;
    default:
      if (nop == 0x1a) goto switchD_00806853_caseD_50;
    case knopDot:
    case knopAsg:
    case knopInstOf:
    case knopIn:
    case knopEqv:
    case knopNEqv:
    case knopComma:
    case knopLogOr:
    case knopLogAnd:
    case knopCoalesce:
    case knopLsh:
    case knopRsh:
    case knopRs2:
    case knopIndex:
    case knopAsgAdd:
    case knopAsgSub:
    case knopAsgMul:
    case knopAsgDiv:
    case knopAsgExpo:
    case knopAsgMod:
    case knopAsgAnd:
    case knopAsgXor:
    case knopAsgOr:
    case knopAsgLsh:
    case knopAsgRsh:
    case knopAsgRs2:
    case knopMember:
    case knopMemberShort:
    case knopSetMember:
    case knopGetMember:
    case knopTemp:
    case knopProg:
    case knopModule:
    case knopEndCode:
    case knopDebugger:
    case knopStrTemplate:
    case knopSwitch:
    case knopCase:
    case knopCatch:
    case knopObjectPatternMember:
switchD_00806853_caseD_30:
      uVar5 = ParseNode::Grfnop(nop);
      if ((uVar5 & 4) == 0) {
        if ((uVar5 & 8) == 0) {
          bVar4 = false;
          local_34 = 0;
        }
        else {
          pPVar12 = ParseNode::AsParseNodeBin(pnode);
          if ((pPVar12->pnode1 == (ParseNodePtr)0x0) || (pPVar12->pnode2 == (ParseNodePtr)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xeb,"(pnodeBin->pnode1 && pnodeBin->pnode2)",
                               "pnodeBin->pnode1 && pnodeBin->pnode2");
            if (!bVar4) goto LAB_00806ab5;
            *puVar6 = 0;
          }
          bVar4 = IsArguments(pPVar12->pnode1);
          if (!bVar4) {
            ppPVar9 = &pPVar12->pnode2;
            goto LAB_00806a53;
          }
          local_34 = 1;
          bVar4 = false;
        }
      }
      else {
        pPVar11 = ParseNode::AsParseNodeUni(pnode);
        ppPVar9 = &pPVar11->pnode1;
        if (pPVar11->pnode1 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xe3,"(pnodeUni->pnode1)","pnodeUni->pnode1");
          if (!bVar4) {
LAB_00806ab5:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
LAB_00806a53:
        pnode = *ppPVar9;
        bVar4 = true;
      }
      bVar14 = (byte)local_34;
joined_r0x00806a66:
      if (!bVar4) {
switchD_00806853_caseD_50:
        return (bool)(bVar14 & 1);
      }
    }
  } while( true );
}

Assistant:

bool IsArguments(ParseNode *pnode)
{
    for (;;)
    {
        switch (pnode->nop)
        {
        case knopName:
            return pnode->AsParseNodeName()->sym && pnode->AsParseNodeName()->sym->IsArguments();

        case knopCall:
        case knopNew:
            if (IsArguments(pnode->AsParseNodeCall()->pnodeTarget))
            {
                return true;
            }

            if (pnode->AsParseNodeCall()->pnodeArgs)
            {
                ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
                while (pnodeArg->nop == knopList)
                {
                    if (IsArguments(pnodeArg->AsParseNodeBin()->pnode1))
                        return true;

                    pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
                }

                pnode = pnodeArg;
                break;
            }

            return false;

        case knopArray:
            if (pnode->AsParseNodeArrLit()->arrayOfNumbers || pnode->AsParseNodeArrLit()->count == 0)
            {
                return false;
            }

            pnode = pnode->AsParseNodeUni()->pnode1;
            break;

        case knopQmark:
            if (IsArguments(pnode->AsParseNodeTri()->pnode1) || IsArguments(pnode->AsParseNodeTri()->pnode2))
            {
                return true;
            }

            pnode = pnode->AsParseNodeTri()->pnode3;
            break;

            //
            // Cases where we don't check for "arguments" yet.
            // Assume that they might have it. Disable the optimization in such scenarios
            //
        case knopList:
        case knopObject:
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopFncDecl:
        case knopClassDecl:
        case knopFor:
        case knopIf:
        case knopDoWhile:
        case knopWhile:
        case knopForIn:
        case knopForOf:
        case knopForAwaitOf:
        case knopReturn:
        case knopBlock:
        case knopBreak:
        case knopContinue:
        case knopTypeof:
        case knopThrow:
        case knopWith:
        case knopFinally:
        case knopTry:
        case knopTryCatch:
        case knopTryFinally:
        case knopArrayPattern:
        case knopObjectPattern:
        case knopParamPattern:
            return true;

        default:
        {
            uint flags = ParseNode::Grfnop(pnode->nop);
            if (flags&fnopUni)
            {
                ParseNodeUni * pnodeUni = pnode->AsParseNodeUni();
                Assert(pnodeUni->pnode1);

                pnode = pnodeUni->pnode1;
                break;
            }
            else if (flags&fnopBin)
            {
                ParseNodeBin * pnodeBin = pnode->AsParseNodeBin();
                Assert(pnodeBin->pnode1 && pnodeBin->pnode2);

                if (IsArguments(pnodeBin->pnode1))
                {
                    return true;
                }

                pnode = pnodeBin->pnode2;
                break;
            }

            return false;
        }

        }
    }
}